

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O3

void __thiscall just::file::impl::output_file::output_file(output_file *this,string *filename_)

{
  pointer pcVar1;
  FILE *pFVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (this->_filename)._M_dataplus._M_p = (pointer)&(this->_filename).field_2;
  pcVar1 = (filename_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + filename_->_M_string_length);
  pFVar2 = fopen((filename_->_M_dataplus)._M_p,"wb");
  this->_f = (FILE *)pFVar2;
  if (pFVar2 == (FILE *)0x0) {
    std::operator+(&local_38,"Error creating file ",filename_);
    throw_errno(&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

explicit output_file(const std::string& filename_) :
          _filename(filename_),
          _f(std::fopen(filename_.c_str(), "wb"))
        {
          if (!_f)
          {
            throw_errno("Error creating file " + filename_);
          }
        }